

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimam.cpp
# Opt level: O0

ssize_t __thiscall
BtorSimArrayModel::read(BtorSimArrayModel *this,int __fd,void *__buf,size_t __nbytes)

{
  mapped_type *ppBVar1;
  BtorSimBitVector *pBVar2;
  uint64_t idx;
  undefined4 in_register_00000034;
  string i;
  undefined4 in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  BtorSimBitVector *in_stack_ffffffffffffff60;
  string local_30 [32];
  BtorSimBitVector *local_10;
  BtorSimArrayModel *local_8;
  
  local_10 = (BtorSimBitVector *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  btorsim_bv_to_string_abi_cxx11_((BtorSimBitVector *)this);
  ppBVar1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                          *)in_stack_ffffffffffffff60,
                         (key_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (*ppBVar1 == (mapped_type)0x0) {
    if (this->const_init == (BtorSimBitVector *)0x0) {
      if (this->random_seed == 0) {
        pBVar2 = btorsim_bv_new((uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        ppBVar1 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                                *)in_stack_ffffffffffffff60,
                               (key_type *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        *ppBVar1 = pBVar2;
      }
      else {
        idx = btorsim_bv_to_uint64(local_10);
        get_random_init(this,idx);
        pBVar2 = btorsim_bv_uint64_to_bv
                           ((uint64_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        ppBVar1 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                                *)in_stack_ffffffffffffff60,
                               (key_type *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        *ppBVar1 = pBVar2;
      }
    }
    else {
      pBVar2 = btorsim_bv_copy(in_stack_ffffffffffffff60);
      ppBVar1 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                              *)in_stack_ffffffffffffff60,
                             (key_type *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      *ppBVar1 = pBVar2;
    }
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                *)in_stack_ffffffffffffff60,
               (key_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  pBVar2 = btorsim_bv_copy(in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_30);
  return (ssize_t)pBVar2;
}

Assistant:

BtorSimBitVector*
BtorSimArrayModel::read (const BtorSimBitVector* index)
{
  assert (index->width == index_width);
  std::string i = btorsim_bv_to_string (index);
  if (!data[i])
  {
    if (const_init)
      data[i] = btorsim_bv_copy (const_init);
    else if (random_seed)
      data[i] = btorsim_bv_uint64_to_bv (
          get_random_init (btorsim_bv_to_uint64 (index)), element_width);
    else
      data[i] = btorsim_bv_new (element_width);
  }
  return btorsim_bv_copy (data[i]);
}